

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_varname(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int yythunkpos205;
  int yypos205;
  int yythunkpos203;
  int yypos203;
  int yythunkpos200;
  int yypos200;
  int yythunkpos199;
  int yypos199;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar4 = yymatchClass(G,(uchar *)"","a-zA-Z_");
  if (iVar4 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    G_local._4_4_ = 0;
  }
  else {
    while( true ) {
      while( true ) {
        iVar1 = G->pos;
        iVar2 = G->thunkpos;
        iVar4 = G->pos;
        iVar3 = G->thunkpos;
        iVar5 = yymatchClass(G,(uchar *)"","a-zA-Z0-9_");
        if (iVar5 == 0) break;
        do {
          iVar1 = G->pos;
          iVar2 = G->thunkpos;
          iVar4 = yymatchClass(G,(uchar *)"","a-zA-Z0-9_");
        } while (iVar4 != 0);
        G->pos = iVar1;
        G->thunkpos = iVar2;
      }
      G->pos = iVar4;
      G->thunkpos = iVar3;
      iVar4 = yymatchChar(G,0x2d);
      if ((iVar4 == 0) || (iVar4 = yymatchClass(G,(uchar *)"","a-zA-Z_"), iVar4 == 0)) break;
      do {
        iVar1 = G->pos;
        iVar2 = G->thunkpos;
        iVar4 = yymatchClass(G,(uchar *)"","a-zA-Z0-9_");
      } while (iVar4 != 0);
      G->pos = iVar1;
      G->thunkpos = iVar2;
    }
    G->pos = iVar1;
    G->thunkpos = iVar2;
    G_local._4_4_ = 1;
  }
  return G_local._4_4_;
}

Assistant:

YY_RULE(int) yy_varname(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "varname"));
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z_")) goto l197;

  l198:;	
  {  int yypos199= G->pos, yythunkpos199= G->thunkpos;
  {  int yypos200= G->pos, yythunkpos200= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9_")) goto l201;

  l202:;	
  {  int yypos203= G->pos, yythunkpos203= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9_")) goto l203;
  goto l202;
  l203:;	  G->pos= yypos203; G->thunkpos= yythunkpos203;
  }  goto l200;
  l201:;	  G->pos= yypos200; G->thunkpos= yythunkpos200;  if (!yymatchChar(G, '-')) goto l199;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z_")) goto l199;

  l204:;	
  {  int yypos205= G->pos, yythunkpos205= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9_")) goto l205;
  goto l204;
  l205:;	  G->pos= yypos205; G->thunkpos= yythunkpos205;
  }
  }
  l200:;	  goto l198;
  l199:;	  G->pos= yypos199; G->thunkpos= yythunkpos199;
  }  yyprintf((stderr, "  ok   varname"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l197:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "varname"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}